

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

void __thiscall sensors_analytics::DefaultConsumer::DumpRecordToDisk(DefaultConsumer *this)

{
  ostream *poVar1;
  _Elt_pointer pbVar2;
  _Elt_pointer pbVar3;
  _Map_pointer ppbVar4;
  ofstream staging_ofs;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(this->data_file_path_)._M_dataplus._M_p,_S_trunc|_S_out);
  pbVar3 = (this->records_).
           super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (pbVar3 != (this->records_).
                super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    pbVar2 = (this->records_).
             super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppbVar4 = (this->records_).
              super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length)
      ;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      pbVar3 = pbVar3 + 1;
      if (pbVar3 == pbVar2) {
        pbVar3 = ppbVar4[1];
        ppbVar4 = ppbVar4 + 1;
        pbVar2 = pbVar3 + 0x10;
      }
    } while (pbVar3 != (this->records_).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur);
  }
  std::ofstream::close();
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _pthread_mutex_init;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

inline void DefaultConsumer::DumpRecordToDisk() {
  std::ofstream staging_ofs
      (data_file_path_.c_str(), std::ofstream::out | std::ofstream::trunc);
  for (std::deque<string>::const_iterator iterator = records_.begin();
       iterator != records_.end(); ++iterator) {
    staging_ofs << *iterator << std::endl;
  }
  staging_ofs.close();
}